

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

bool __thiscall google::protobuf::MapKey::operator==(MapKey *this,MapKey *other)

{
  __type _Var1;
  CppType CVar2;
  LogMessage *pLVar3;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (this->type_ != other->type_) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/map_field.h"
               ,0xb3);
    pLVar3 = internal::LogMessage::operator<<(&local_60,"Unsupported: type mismatch");
    internal::LogFinisher::operator=(&local_21,pLVar3);
    internal::LogMessage::~LogMessage(&local_60);
  }
  CVar2 = type(this);
  switch(CVar2) {
  case CPPTYPE_INT32:
  case CPPTYPE_UINT32:
    _Var1 = (this->val_).int32_value_ == (other->val_).int32_value_;
    break;
  case CPPTYPE_INT64:
  case CPPTYPE_UINT64:
    _Var1 = (this->val_).int64_value_ == (other->val_).int64_value_;
    break;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
  case CPPTYPE_MESSAGE:
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/map_field.h"
               ,0xba);
    pLVar3 = internal::LogMessage::operator<<(&local_60,"Unsupported");
    internal::LogFinisher::operator=(&local_21,pLVar3);
    internal::LogMessage::~LogMessage(&local_60);
  default:
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/map_field.h"
               ,0xc9);
    pLVar3 = internal::LogMessage::operator<<(&local_60,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_21,pLVar3);
    internal::LogMessage::~LogMessage(&local_60);
    _Var1 = false;
    break;
  case CPPTYPE_BOOL:
    _Var1 = (this->val_).bool_value_ == (other->val_).bool_value_;
    break;
  case CPPTYPE_STRING:
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)other);
  }
  return _Var1;
}

Assistant:

bool operator==(const MapKey& other) const {
    if (type_ != other.type_) {
      // To be consistent with operator<, we don't allow this either.
      GOOGLE_LOG(FATAL) << "Unsupported: type mismatch";
    }
    switch (type()) {
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Unsupported";
        break;
      case FieldDescriptor::CPPTYPE_STRING:
        return val_.string_value_.get() == other.val_.string_value_.get();
      case FieldDescriptor::CPPTYPE_INT64:
        return val_.int64_value_ == other.val_.int64_value_;
      case FieldDescriptor::CPPTYPE_INT32:
        return val_.int32_value_ == other.val_.int32_value_;
      case FieldDescriptor::CPPTYPE_UINT64:
        return val_.uint64_value_ == other.val_.uint64_value_;
      case FieldDescriptor::CPPTYPE_UINT32:
        return val_.uint32_value_ == other.val_.uint32_value_;
      case FieldDescriptor::CPPTYPE_BOOL:
        return val_.bool_value_ == other.val_.bool_value_;
    }
    GOOGLE_LOG(FATAL) << "Can't get here.";
    return false;
  }